

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::registerConnectorInterfaces(Federate *this,string *configString)

{
  ConfigType CVar1;
  string_view configString_00;
  
  configString_00._M_str = (configString->_M_dataplus)._M_p;
  configString_00._M_len = configString->_M_string_length;
  CVar1 = fileops::getConfigType(configString_00);
  if (1 < CVar1 - TOML_STRING) {
    if (CVar1 < TOML_STRING) {
      registerConnectorInterfacesJson(this,configString);
    }
    return;
  }
  registerConnectorInterfacesToml(this,configString);
  return;
}

Assistant:

void Federate::registerConnectorInterfaces(const std::string& configString)
{
    auto hint = fileops::getConfigType(configString);
    switch (hint) {
        case fileops::ConfigType::JSON_FILE:
        case fileops::ConfigType::JSON_STRING:
            try {
                registerConnectorInterfacesJson(configString);
            }
            catch (const std::invalid_argument& e) {
                throw(helics::InvalidParameter(e.what()));
            }
            break;
        case fileops::ConfigType::TOML_FILE:
        case fileops::ConfigType::TOML_STRING:
            registerConnectorInterfacesToml(configString);
            break;
        case fileops::ConfigType::NONE:
        default:
            break;
    }
}